

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int32_t zng_inflateReset2(zng_stream *strm,int32_t windowBits)

{
  internal_state *piVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (windowBits < 0) {
      if (windowBits < -0xf) {
        return -2;
      }
      iVar2 = 0;
      uVar4 = -windowBits;
    }
    else {
      iVar2 = ((uint)windowBits >> 4) + 5;
      uVar4 = windowBits & 0xf;
      if (0x2f < windowBits) {
        uVar4 = windowBits;
      }
    }
    if ((uVar4 - 8 < 8) || (uVar4 == 0)) {
      *(int *)&piVar1->pending_out = iVar2;
      piVar1->block_open = uVar4;
      iVar3 = zng_inflateReset(strm);
      return iVar3;
    }
  }
  return -2;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateReset2)(PREFIX3(stream) *strm, int32_t windowBits) {
    int wrap;
    struct inflate_state *state;

    /* get the state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;

    /* extract wrap request from windowBits parameter */
    if (windowBits < 0) {
        wrap = 0;
        if (windowBits < -MAX_WBITS)
            return Z_STREAM_ERROR;
        windowBits = -windowBits;
    } else {
        wrap = (windowBits >> 4) + 5;
#ifdef GUNZIP
        if (windowBits < 48)
            windowBits &= MAX_WBITS;
#endif
    }

    /* set number of window bits */
    if (windowBits && (windowBits < MIN_WBITS || windowBits > MAX_WBITS))
        return Z_STREAM_ERROR;

    /* update state and reset the rest of it */
    state->wrap = wrap;
    state->wbits = (unsigned)windowBits;
    return PREFIX(inflateReset)(strm);
}